

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.h
# Opt level: O0

void __thiscall CBlockHeader::SetNull(CBlockHeader *this)

{
  long lVar1;
  base_blob<256U> *in_RDI;
  long in_FS_OFFSET;
  base_blob<256U> *pbVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->m_data)._M_elems[0] = '\0';
  (in_RDI->m_data)._M_elems[1] = '\0';
  (in_RDI->m_data)._M_elems[2] = '\0';
  (in_RDI->m_data)._M_elems[3] = '\0';
  pbVar2 = in_RDI;
  base_blob<256U>::SetNull(in_RDI);
  base_blob<256U>::SetNull(pbVar2);
  pbVar2 = in_RDI + 2;
  (pbVar2->m_data)._M_elems[4] = '\0';
  (pbVar2->m_data)._M_elems[5] = '\0';
  (pbVar2->m_data)._M_elems[6] = '\0';
  (pbVar2->m_data)._M_elems[7] = '\0';
  pbVar2 = in_RDI + 2;
  (pbVar2->m_data)._M_elems[8] = '\0';
  (pbVar2->m_data)._M_elems[9] = '\0';
  (pbVar2->m_data)._M_elems[10] = '\0';
  (pbVar2->m_data)._M_elems[0xb] = '\0';
  pbVar2 = in_RDI + 2;
  (pbVar2->m_data)._M_elems[0xc] = '\0';
  (pbVar2->m_data)._M_elems[0xd] = '\0';
  (pbVar2->m_data)._M_elems[0xe] = '\0';
  (pbVar2->m_data)._M_elems[0xf] = '\0';
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SetNull()
    {
        nVersion = 0;
        hashPrevBlock.SetNull();
        hashMerkleRoot.SetNull();
        nTime = 0;
        nBits = 0;
        nNonce = 0;
    }